

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetIRCHKNumberOfSources(ndicapi *pol,int side)

{
  int iVar1;
  long lVar2;
  int m;
  int n;
  char *dp;
  int side_local;
  ndicapi *pol_local;
  
  if (pol->IrchkSources[0] == '\0') {
    pol_local._4_4_ = 0;
  }
  else {
    lVar2 = ndiSignedToLong(pol->IrchkSources,3);
    pol_local._4_4_ = (int)lVar2;
    if ((pol_local._4_4_ < 0) || (0x14 < pol_local._4_4_)) {
      pol_local._4_4_ = 0;
    }
    else {
      lVar2 = ndiSignedToLong(pol->IrchkSources + (long)(pol_local._4_4_ * 6) + 3,3);
      iVar1 = (int)lVar2;
      if ((iVar1 < 0) || (0x14 < iVar1)) {
        pol_local._4_4_ = 0;
      }
      else if ((side != 0) && (pol_local._4_4_ = iVar1, side != 1)) {
        pol_local._4_4_ = 0;
      }
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetIRCHKNumberOfSources(ndicapi* pol, int side)
{
  const char* dp;
  int n, m;

  dp = pol->IrchkSources;

  if (*dp == '\0')
  {
    return 0;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0 || n > 20)
  {
    return 0;
  }
  m = (int)ndiSignedToLong(dp + 3 + 2 * 3 * n, 3);
  if (m < 0 || m > 20)
  {
    return 0;
  }

  if (side == NDI_LEFT)
  {
    return n;
  }
  else if (side == NDI_RIGHT)
  {
    return m;
  }

  return 0;
}